

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  uint uVar1;
  rt_expression_interface<double> *prVar2;
  ostream *poVar3;
  string local_68 [48];
  string local_38 [32];
  rt_expr<viennamath::rt_expression_interface<double>_> *local_18;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  ostream *stream_local;
  
  local_18 = e;
  e_local = (rt_expr<viennamath::rt_expression_interface<double>_> *)stream;
  prVar2 = rt_expr<viennamath::rt_expression_interface<double>_>::get(e);
  uVar1 = (*prVar2->_vptr_rt_expression_interface[7])();
  if ((uVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)e_local,"expr");
    prVar2 = rt_expr<viennamath::rt_expression_interface<double>_>::get(local_18);
    (*prVar2->_vptr_rt_expression_interface[3])();
    std::operator<<(poVar3,local_68);
    std::__cxx11::string::~string(local_68);
  }
  else {
    poVar3 = std::operator<<((ostream *)e_local,"expr");
    poVar3 = std::operator<<(poVar3,"(");
    prVar2 = rt_expr<viennamath::rt_expression_interface<double>_>::get(local_18);
    (*prVar2->_vptr_rt_expression_interface[3])();
    poVar3 = std::operator<<(poVar3,local_38);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string(local_38);
  }
  return (ostream *)e_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_expr<InterfaceType> const & e)
  {
    if (e.get()->is_unary())
    {
      stream << "expr"
            << "("
            << e.get()->deep_str()
            << ")";
    }
    else
    {
      stream << "expr"
            << e.get()->deep_str();
    }

    return stream;
  }